

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O1

void ImTui::ShowStyleEditor(ImGuiStyle *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFont *font;
  ImFontConfig *pIVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  bool bVar7;
  ImU32 IVar8;
  ImGuiStyle *v;
  char *pcVar9;
  size_t sVar10;
  ImFontGlyph *pIVar11;
  ImDrawList *this;
  int i;
  long lVar12;
  ulong uVar13;
  void *ptr_id;
  uint uVar14;
  ImVec4 *pIVar15;
  ImWchar c;
  ImVec4 *pIVar16;
  ImGuiStyle *__dest;
  int i_1;
  int iVar17;
  uint uVar18;
  ImFontAtlas *pIVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool window_border;
  ImVec2 cell_p2;
  ImVec4 local_b8;
  float local_a8;
  float local_a4;
  ImGuiIO *local_a0;
  ImVec4 local_98;
  ImFontAtlas *local_88;
  ulong local_80;
  ImVec2 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  v = ImGui::GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar17 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar17 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar20 = ImGui::GetWindowWidth();
  ImGui::PushItemWidth(fVar20 * 0.5);
  bVar6 = ImGui::ShowStyleSelector("Colors##Selector");
  if (bVar6) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
  }
  ImGui::ShowFontSelector("Fonts##Selector");
  bVar6 = ImGui::SliderFloat("FrameRounding",&v->FrameRounding,0.0,12.0,"%.0f",0);
  if (bVar6) {
    v->GrabRounding = v->FrameRounding;
  }
  local_b8.x._0_1_ = 0.0 < v->WindowBorderSize;
  bVar6 = ImGui::Checkbox("WindowBorder",(bool *)&local_b8);
  if (bVar6) {
    if (local_b8.x._0_1_ == '\0') {
      fVar20 = 0.0;
    }
    else {
      fVar20 = 1.0;
    }
    v->WindowBorderSize = fVar20;
  }
  ImGui::SameLine(0.0,-1.0);
  local_b8.x._0_1_ = 0.0 < v->FrameBorderSize;
  bVar6 = ImGui::Checkbox("FrameBorder",(bool *)&local_b8);
  if (bVar6) {
    if (local_b8.x._0_1_ == '\0') {
      fVar20 = 0.0;
    }
    else {
      fVar20 = 1.0;
    }
    v->FrameBorderSize = fVar20;
  }
  ImGui::SameLine(0.0,-1.0);
  local_b8.x._0_1_ = 0.0 < v->PopupBorderSize;
  bVar6 = ImGui::Checkbox("PopupBorder",(bool *)&local_b8);
  if (bVar6) {
    if (local_b8.x._0_1_ == '\0') {
      fVar20 = 0.0;
    }
    else {
      fVar20 = 1.0;
    }
    v->PopupBorderSize = fVar20;
  }
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  bVar6 = ImGui::Button("Save Ref",(ImVec2 *)&local_b8);
  if (bVar6) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
    memmove(__dest,v,0x414);
  }
  ImGui::SameLine(0.0,-1.0);
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  bVar6 = ImGui::Button("Revert Ref",(ImVec2 *)&local_b8);
  if (bVar6) {
    memcpy(v,__dest,0x414);
  }
  ImGui::SameLine(0.0,-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  ImGui::Separator();
  bVar6 = ImGui::BeginTabBar("##tabs",0);
  if (bVar6) {
    bVar6 = ImGui::BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar6) {
      ImGui::Text("Main");
      ImGui::SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",0);
      ImGui::SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",0);
      ImGui::SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",0);
      ImGui::SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",0);
      ImGui::SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",0);
      ImGui::SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",0);
      ImGui::SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",0);
      ImGui::SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",0);
      ImGui::Text("Borders");
      ImGui::SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",0);
      ImGui::SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",0);
      ImGui::SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",0);
      ImGui::SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",0);
      ImGui::SliderFloat("TabBorderSize",&v->TabBorderSize,0.0,1.0,"%.0f",0);
      ImGui::Text("Rounding");
      ImGui::SliderFloat("WindowRounding",&v->WindowRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("ChildRounding",&v->ChildRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("FrameRounding",&v->FrameRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("PopupRounding",&v->PopupRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("TabRounding",&v->TabRounding,0.0,12.0,"%.0f",0);
      ImGui::Text("Alignment");
      ImGui::SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",0);
      local_b8.x = (float)(v->WindowMenuButtonPosition + 1);
      bVar6 = ImGui::Combo("WindowMenuButtonPosition",(int *)&local_b8,"None",-1);
      if (bVar6) {
        v->WindowMenuButtonPosition = (int)local_b8.x + -1;
      }
      ImGui::Combo("ColorButtonPosition",&v->ColorButtonPosition,"Left",-1);
      ImGui::SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",0);
      ImGui::SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      ImGui::SliderFloat2("SelectableTextAlign",&(v->SelectableTextAlign).x,0.0,1.0,"%.2f",0);
      ImGui::SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      ImGui::Text("Safe Area Padding");
      ImGui::SameLine(0.0,-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      ImGui::SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",0)
      ;
      ImGui::EndTabItem();
    }
    bVar6 = ImGui::BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar6) {
      local_b8.x = 0.0;
      local_b8.y = 0.0;
      bVar6 = ImGui::Button("Export",(ImVec2 *)&local_b8);
      if (bVar6) {
        if (ShowStyleEditor::output_dest == 0) {
          ImGui::LogToClipboard(-1);
        }
        else {
          ImGui::LogToTTY(-1);
        }
        lVar12 = 0;
        ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        pIVar16 = v->Colors;
        pIVar15 = __dest->Colors;
        do {
          pcVar9 = ImGui::GetStyleColorName((ImGuiCol)lVar12);
          if ((ShowStyleEditor::output_only_modified != true) ||
             (auVar21[0] = -(*(char *)&pIVar15->x == *(char *)&pIVar16->x),
             auVar21[1] = -(*(char *)((long)&pIVar15->x + 1) == *(char *)((long)&pIVar16->x + 1)),
             auVar21[2] = -(*(char *)((long)&pIVar15->x + 2) == *(char *)((long)&pIVar16->x + 2)),
             auVar21[3] = -(*(char *)((long)&pIVar15->x + 3) == *(char *)((long)&pIVar16->x + 3)),
             auVar21[4] = -(*(char *)&pIVar15->y == *(char *)&pIVar16->y),
             auVar21[5] = -(*(char *)((long)&pIVar15->y + 1) == *(char *)((long)&pIVar16->y + 1)),
             auVar21[6] = -(*(char *)((long)&pIVar15->y + 2) == *(char *)((long)&pIVar16->y + 2)),
             auVar21[7] = -(*(char *)((long)&pIVar15->y + 3) == *(char *)((long)&pIVar16->y + 3)),
             auVar21[8] = -(*(char *)&pIVar15->z == *(char *)&pIVar16->z),
             auVar21[9] = -(*(char *)((long)&pIVar15->z + 1) == *(char *)((long)&pIVar16->z + 1)),
             auVar21[10] = -(*(char *)((long)&pIVar15->z + 2) == *(char *)((long)&pIVar16->z + 2)),
             auVar21[0xb] = -(*(char *)((long)&pIVar15->z + 3) == *(char *)((long)&pIVar16->z + 3)),
             auVar21[0xc] = -(*(char *)&pIVar15->w == *(char *)&pIVar16->w),
             auVar21[0xd] = -(*(char *)((long)&pIVar15->w + 1) == *(char *)((long)&pIVar16->w + 1)),
             auVar21[0xe] = -(*(char *)((long)&pIVar15->w + 2) == *(char *)((long)&pIVar16->w + 2)),
             auVar21[0xf] = -(*(char *)((long)&pIVar15->w + 3) == *(char *)((long)&pIVar16->w + 3)),
             (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar21[0xf] >> 7) << 0xf) != 0xffff)) {
            sVar10 = strlen(pcVar9);
            ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                           (double)pIVar16->x,(double)pIVar16->y,(double)pIVar16->z,
                           (double)pIVar16->w,pcVar9,(ulong)(0x17 - (int)sVar10),"");
          }
          lVar12 = lVar12 + 1;
          pIVar15 = pIVar15 + 1;
          pIVar16 = pIVar16 + 1;
        } while (lVar12 != 0x35);
        ImGui::LogFinish();
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::SetNextItemWidth(120.0);
      ImGui::Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      ImGui::SameLine(0.0,-1.0);
      ImGui::Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
        iVar17 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
        if (iVar17 != 0) {
          ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
          __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
          __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
        }
      }
      fVar20 = ImGui::GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar20 * 16.0);
      lVar12 = 0;
      ImGui::RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
      ImGui::SameLine(0.0,-1.0);
      ImGui::RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x20000);
      ImGui::SameLine(0.0,-1.0);
      ImGui::RadioButton("Both",&ShowStyleEditor::alpha_flags,0x40000);
      ImGui::SameLine(0.0,-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu."
                );
      local_b8.x = 0.0;
      local_b8.y = 0.0;
      ImGui::BeginChild("##colors",(ImVec2 *)&local_b8,true,0x80c000);
      fVar20 = ImGui::GetWindowWidth();
      ImGui::PushItemWidth(fVar20 * 0.5);
      pIVar16 = v->Colors;
      pIVar15 = __dest->Colors;
      do {
        pcVar9 = ImGui::GetStyleColorName((ImGuiCol)lVar12);
        bVar6 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar9,(char *)0x0);
        if (bVar6) {
          ImGui::PushID((ImGuiCol)lVar12);
          ImGui::ColorEdit4("##color",&pIVar16->x,ShowStyleEditor::alpha_flags | 0x10000);
          auVar22[0] = -(*(char *)&pIVar15->x == *(char *)&pIVar16->x);
          auVar22[1] = -(*(char *)((long)&pIVar15->x + 1) == *(char *)((long)&pIVar16->x + 1));
          auVar22[2] = -(*(char *)((long)&pIVar15->x + 2) == *(char *)((long)&pIVar16->x + 2));
          auVar22[3] = -(*(char *)((long)&pIVar15->x + 3) == *(char *)((long)&pIVar16->x + 3));
          auVar22[4] = -(*(char *)&pIVar15->y == *(char *)&pIVar16->y);
          auVar22[5] = -(*(char *)((long)&pIVar15->y + 1) == *(char *)((long)&pIVar16->y + 1));
          auVar22[6] = -(*(char *)((long)&pIVar15->y + 2) == *(char *)((long)&pIVar16->y + 2));
          auVar22[7] = -(*(char *)((long)&pIVar15->y + 3) == *(char *)((long)&pIVar16->y + 3));
          auVar22[8] = -(*(char *)&pIVar15->z == *(char *)&pIVar16->z);
          auVar22[9] = -(*(char *)((long)&pIVar15->z + 1) == *(char *)((long)&pIVar16->z + 1));
          auVar22[10] = -(*(char *)((long)&pIVar15->z + 2) == *(char *)((long)&pIVar16->z + 2));
          auVar22[0xb] = -(*(char *)((long)&pIVar15->z + 3) == *(char *)((long)&pIVar16->z + 3));
          auVar22[0xc] = -(*(char *)&pIVar15->w == *(char *)&pIVar16->w);
          auVar22[0xd] = -(*(char *)((long)&pIVar15->w + 1) == *(char *)((long)&pIVar16->w + 1));
          auVar22[0xe] = -(*(char *)((long)&pIVar15->w + 2) == *(char *)((long)&pIVar16->w + 2));
          auVar22[0xf] = -(*(char *)((long)&pIVar15->w + 3) == *(char *)((long)&pIVar16->w + 3));
          if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar22[0xf] >> 7) << 0xf) != 0xffff) {
            ImGui::SameLine(0.0,(v->ItemInnerSpacing).x);
            local_b8.x = 0.0;
            local_b8.y = 0.0;
            bVar6 = ImGui::Button("Save",(ImVec2 *)&local_b8);
            if (bVar6) {
              fVar20 = pIVar16->y;
              fVar4 = pIVar16->z;
              fVar5 = pIVar16->w;
              pIVar15->x = pIVar16->x;
              pIVar15->y = fVar20;
              pIVar15->z = fVar4;
              pIVar15->w = fVar5;
            }
            ImGui::SameLine(0.0,(v->ItemInnerSpacing).x);
            local_b8.x = 0.0;
            local_b8.y = 0.0;
            bVar6 = ImGui::Button("Revert",(ImVec2 *)&local_b8);
            if (bVar6) {
              fVar20 = pIVar15->y;
              fVar4 = pIVar15->z;
              fVar5 = pIVar15->w;
              pIVar16->x = pIVar15->x;
              pIVar16->y = fVar20;
              pIVar16->z = fVar4;
              pIVar16->w = fVar5;
            }
          }
          ImGui::SameLine(0.0,(v->ItemInnerSpacing).x);
          ImGui::TextUnformatted(pcVar9,(char *)0x0);
          ImGui::PopID();
        }
        lVar12 = lVar12 + 1;
        pIVar15 = pIVar15 + 1;
        pIVar16 = pIVar16 + 1;
      } while (lVar12 != 0x35);
      ImGui::PopItemWidth();
      ImGui::EndChild();
      ImGui::EndTabItem();
    }
    bVar6 = ImGui::BeginTabItem("Fonts",(bool *)0x0,0);
    if (bVar6) {
      local_a0 = ImGui::GetIO();
      pIVar19 = local_a0->Fonts;
      HelpMarker("Read FAQ and docs/FONTS.txt for details on font loading.");
      ImGui::PushItemWidth(120.0);
      if (0 < (pIVar19->Fonts).Size) {
        uVar13 = 0;
        local_88 = pIVar19;
        do {
          font = (pIVar19->Fonts).Data[uVar13];
          ImGui::PushID(font);
          pcVar9 = font->ConfigData->Name;
          if (font->ConfigData == (ImFontConfig *)0x0) {
            pcVar9 = "";
          }
          local_80 = uVar13;
          bVar6 = ImGui::TreeNode(font,"Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
                                  (double)font->FontSize,uVar13 & 0xffffffff,pcVar9,
                                  (ulong)(uint)(font->Glyphs).Size,
                                  (ulong)(uint)(int)font->ConfigDataCount);
          ImGui::SameLine(0.0,-1.0);
          bVar7 = ImGui::SmallButton("Set as default");
          if (bVar7) {
            local_a0->FontDefault = font;
          }
          if (bVar6) {
            ImGui::PushFont(font);
            ImGui::Text("The quick brown fox jumps over the lazy dog");
            ImGui::PopFont();
            ImGui::DragFloat("Font scale",&font->Scale,0.005,0.3,2.0,"%.1f",0);
            ImGui::SameLine(0.0,-1.0);
            HelpMarker(
                      "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                      );
            ImGui::Text("Ascent: %f, Descent: %f, Height: %f",(double)font->Ascent,
                        (double)font->Descent,(double)(font->Ascent - font->Descent));
            ImGui::Text("Fallback character: \'%c\' (U+%04X)",(ulong)font->FallbackChar);
            ImGui::Text("Ellipsis character: \'%c\' (U+%04X)",(ulong)font->EllipsisChar);
            fVar20 = (float)font->MetricsTotalSurface;
            if (fVar20 < 0.0) {
              fVar20 = sqrtf(fVar20);
            }
            else {
              fVar20 = SQRT(fVar20);
            }
            ImGui::Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)font->MetricsTotalSurface
                        ,(ulong)(uint)(int)fVar20);
            if (0 < font->ConfigDataCount) {
              lVar12 = 0x56;
              uVar13 = 0;
              do {
                pIVar3 = font->ConfigData;
                if (pIVar3 != (ImFontConfig *)0x0) {
                  ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",
                                    uVar13 & 0xffffffff,pIVar3->Name + lVar12 + -0x56,
                                    (ulong)*(uint *)((long)pIVar3 + lVar12 + -0x3e),
                                    (ulong)*(uint *)((long)pIVar3 + lVar12 + -0x3a),
                                    (ulong)*(byte *)((long)pIVar3 + lVar12 + -0x36));
                }
                uVar13 = uVar13 + 1;
                lVar12 = lVar12 + 0x88;
              } while ((long)uVar13 < (long)font->ConfigDataCount);
            }
            bVar6 = ImGui::TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(font->Glyphs).Size);
            if (bVar6) {
              ptr_id = (void *)0x0;
              do {
                iVar17 = 0;
                uVar14 = 0;
                do {
                  pIVar11 = ImFont::FindGlyphNoFallback(font,(short)ptr_id + (short)iVar17);
                  uVar14 = (uVar14 + 1) - (uint)(pIVar11 == (ImFontGlyph *)0x0);
                  iVar17 = iVar17 + 1;
                } while (iVar17 != 0x100);
                if (uVar14 != 0) {
                  pcVar9 = "glyphs";
                  if (uVar14 == 1) {
                    pcVar9 = "glyph";
                  }
                  bVar6 = ImGui::TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",(ulong)ptr_id & 0xffffffff
                                          ,(ulong)((uint)ptr_id | 0xff),(ulong)uVar14,pcVar9);
                  if (bVar6) {
                    local_a4 = font->FontSize;
                    local_a8 = (v->ItemSpacing).y;
                    local_78 = ImGui::GetCursorScreenPos();
                    this = ImGui::GetWindowDrawList();
                    local_a8 = local_a8 + local_a4;
                    local_68 = local_78.y;
                    fStack_64 = local_78.y;
                    fStack_60 = local_78.y;
                    fStack_5c = local_78.y;
                    uVar13 = 0;
                    do {
                      uVar18 = (uint)uVar13;
                      local_b8.x = (float)(uVar18 & 0xf) * local_a8 + local_78.x;
                      local_b8.y = (float)(int)(uVar13 >> 4) * local_a8 + local_68;
                      local_98.y = local_b8.y + local_a4;
                      local_98.x = local_b8.x + local_a4;
                      uVar14 = (uint)ptr_id + uVar18;
                      c = (ImWchar)uVar14;
                      pIVar11 = ImFont::FindGlyphNoFallback(font,c);
                      IVar8 = 0x64ffffff;
                      if (pIVar11 == (ImFontGlyph *)0x0) {
                        IVar8 = 0x32ffffff;
                      }
                      ImDrawList::AddRect(this,(ImVec2 *)&local_b8,(ImVec2 *)&local_98,IVar8,0.0,0xf
                                          ,1.0);
                      if (pIVar11 != (ImFontGlyph *)0x0) {
                        local_58.x = local_b8.x;
                        local_58.y = local_b8.y;
                        uStack_50 = 0;
                        IVar8 = ImGui::GetColorU32(0,1.0);
                        ImFont::RenderChar(font,this,local_a4,local_58,IVar8,c);
                        bVar6 = ImGui::IsMouseHoveringRect
                                          ((ImVec2 *)&local_b8,(ImVec2 *)&local_98,true);
                        if (bVar6) {
                          ImGui::BeginTooltip();
                          ImGui::Text("Codepoint: U+%04X",(ulong)uVar14);
                          ImGui::Separator();
                          ImGui::Text("AdvanceX: %.1f",(double)pIVar11->AdvanceX);
                          ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar11->X0,
                                      (double)pIVar11->Y0,(double)pIVar11->X1,(double)pIVar11->Y1);
                          ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar11->U0,
                                      (double)pIVar11->V0,(double)pIVar11->U1,(double)pIVar11->V1);
                          ImGui::EndTooltip();
                        }
                      }
                      uVar13 = (ulong)(uVar18 + 1);
                    } while (uVar18 + 1 != 0x100);
                    local_b8.y = local_a8 * 16.0;
                    local_b8.x = local_a8 * 16.0;
                    ImGui::Dummy((ImVec2 *)&local_b8);
                    ImGui::TreePop();
                  }
                }
                bVar6 = ptr_id < (void *)0xff00;
                ptr_id = (void *)((long)ptr_id + 0x100);
              } while (bVar6);
              ImGui::TreePop();
            }
            ImGui::TreePop();
            pIVar19 = local_88;
          }
          ImGui::PopID();
          uVar13 = local_80 + 1;
        } while ((long)uVar13 < (long)(pIVar19->Fonts).Size);
      }
      bVar6 = ImGui::TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",
                              (ulong)(uint)pIVar19->TexWidth);
      if (bVar6) {
        local_b8.x = 1.0;
        local_b8.y = 1.0;
        local_b8.z = 1.0;
        local_b8.w = 1.0;
        local_98.x = 1.0;
        local_98.y = 1.0;
        local_98.z = 1.0;
        local_98.w = 0.5;
        uVar1 = pIVar19->TexWidth;
        uVar2 = pIVar19->TexHeight;
        local_38.x = (float)(int)uVar1;
        local_38.y = (float)(int)uVar2;
        local_40.x = 0.0;
        local_40.y = 0.0;
        local_48.x = 1.0;
        local_48.y = 1.0;
        ImGui::Image(pIVar19->TexID,&local_38,&local_40,&local_48,&local_b8,&local_98);
        ImGui::TreePop();
      }
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure."
                );
      bVar6 = ImGui::DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",0)
      ;
      if (bVar6) {
        ImGui::SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      ImGui::DragFloat("global scale",&local_a0->FontGlobalScale,0.005,0.3,2.0,"%.2f",0);
      ImGui::PopItemWidth();
      ImGui::EndTabItem();
    }
    bVar6 = ImGui::BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar6) {
      ImGui::Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
      ImGui::SameLine(0.0,-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      ImGui::Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
      ImGui::PushItemWidth(100.0);
      ImGui::DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,
                       3.4028235e+38,"%.2f",0x20);
      if (v->CurveTessellationTol <= 0.1 && v->CurveTessellationTol != 0.1) {
        v->CurveTessellationTol = 0.1;
      }
      ImGui::DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",0);
      ImGui::PopItemWidth();
      ImGui::EndTabItem();
    }
    ImGui::EndTabBar();
  }
  ImGui::PopItemWidth();
  return;
}

Assistant:

void ImTui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding"); ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine();
            ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine();
            ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf); ImGui::SameLine();
            HelpMarker("In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(ImGui::GetWindowWidth()*0.5f);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                    // Read the FAQ and docs/FONTS.txt about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.txt for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                bool font_details_opened = ImGui::TreeNode(font, "Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
                ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) { io.FontDefault = font; }
                if (font_details_opened)
                {
                    ImGui::PushFont(font);
                    ImGui::Text("The quick brown fox jumps over the lazy dog");
                    ImGui::PopFont();
                    ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                    ImGui::SameLine(); HelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                    ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                    ImGui::Text("Fallback character: '%c' (U+%04X)", font->FallbackChar, font->FallbackChar);
                    ImGui::Text("Ellipsis character: '%c' (U+%04X)", font->EllipsisChar, font->EllipsisChar);
                    const float surface_sqrt = sqrtf((float)font->MetricsTotalSurface);
                    ImGui::Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, (int)surface_sqrt, (int)surface_sqrt);
                    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                        if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                            ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                    if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                    {
                        // Display all glyphs of the fonts in separate pages of 256 characters
                        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
                        {
                            int count = 0;
                            for (unsigned int n = 0; n < 256; n++)
                                count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                            if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                            {
                                float cell_size = font->FontSize * 1;
                                float cell_spacing = style.ItemSpacing.y;
                                ImVec2 base_pos = ImGui::GetCursorScreenPos();
                                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                                for (unsigned int n = 0; n < 256; n++)
                                {
                                    ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                    ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                    const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                                    draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                                    if (glyph)
                                        font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base + n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                    if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                    {
                                        ImGui::BeginTooltip();
                                        ImGui::Text("Codepoint: U+%04X", base + n);
                                        ImGui::Separator();
                                        ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                        ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                        ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                        ImGui::EndTooltip();
                                    }
                                }
                                ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                                ImGui::TreePop();
                            }
                        }
                        ImGui::TreePop();
                    }
                    ImGui::TreePop();
                }
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            HelpMarker("Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.2f"))   // scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.2f");      // scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, "%.2f", ImGuiSliderFlags_Logarithmic);
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;
            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}